

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_pd.c
# Opt level: O2

void pd_free(t_pd *x)

{
  t_pd p_Var1;
  
  p_Var1 = *x;
  if (p_Var1->c_freemethod != (t_method)0x0) {
    (*p_Var1->c_freemethod)(x);
  }
  if (p_Var1->c_patchable != '\0') {
    while (x[3] != (t_pd)0x0) {
      outlet_free((_outlet *)x[3]);
    }
    while (x[4] != (t_pd)0x0) {
      inlet_free((_inlet *)x[4]);
    }
    if (x[2] != (t_pd)0x0) {
      binbuf_free((_binbuf *)x[2]);
    }
  }
  if (p_Var1->c_size != 0) {
    freebytes(x,p_Var1->c_size);
    return;
  }
  return;
}

Assistant:

void pd_free(t_pd *x)
{
    t_class *c = *x;
    if (c->c_freemethod) (*(t_gotfn)(c->c_freemethod))(x);
    if (c->c_patchable)
    {
        while (((t_object *)x)->ob_outlet)
            outlet_free(((t_object *)x)->ob_outlet);
        while (((t_object *)x)->ob_inlet)
            inlet_free(((t_object *)x)->ob_inlet);
        if (((t_object *)x)->ob_binbuf)
            binbuf_free(((t_object *)x)->ob_binbuf);
    }
    if (c->c_size) t_freebytes(x, c->c_size);
}